

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void __thiscall google::protobuf::compiler::Version::Clear(Version *this)

{
  uint uVar1;
  uint32_t *puVar2;
  uint32_t cached_has_bits;
  Version *this_local;
  
  puVar2 = protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar2;
  if ((uVar1 & 1) != 0) {
    protobuf::internal::ArenaStringPtr::ClearNonDefaultToEmpty(&(this->field_0)._impl_.suffix_);
  }
  if ((uVar1 & 0xe) != 0) {
    memset((void *)((long)&this->field_0 + 0x10),0,0xc);
  }
  protobuf::internal::HasBits<1>::Clear(&(this->field_0)._impl_._has_bits_);
  protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            ((InternalMetadata *)&this->field_0x8);
  return;
}

Assistant:

PROTOBUF_NOINLINE void Version::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.compiler.Version)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _impl_._has_bits_[0];
  if (cached_has_bits & 0x00000001u) {
    _impl_.suffix_.ClearNonDefaultToEmpty();
  }
  if (cached_has_bits & 0x0000000eu) {
    ::memset(&_impl_.major_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.patch_) -
        reinterpret_cast<char*>(&_impl_.major_)) + sizeof(_impl_.patch_));
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}